

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O3

bool __thiscall
flatbuffers::csharp::CSharpGenerator::SaveType
          (CSharpGenerator *this,string *defname,Namespace *ns,string *classcode,bool needs_includes
          ,IDLOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  char *__s;
  long *plVar5;
  size_type *psVar6;
  Namespace *ns_00;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  string namespace_name;
  string code;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  Namespace *local_58;
  size_t local_50;
  pointer local_48;
  pointer pbStack_40;
  CSharpGenerator *local_38;
  
  if (classcode->_M_string_length == 0) {
    bVar4 = true;
  }
  else {
    __s = BaseGenerator::FlatBuffersGeneratedWarning();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,__s,(allocator<char> *)&local_98);
    local_38 = this;
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x364351);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78.field_2._8_8_ = plVar5[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_78._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
    local_58 = (Namespace *)&local_48;
    ns_00 = (Namespace *)(plVar5 + 2);
    if ((Namespace *)*plVar5 == ns_00) {
      local_48 = (ns_00->components).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbStack_40 = (pointer)plVar5[3];
    }
    else {
      local_48 = (ns_00->components).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_58 = (Namespace *)*plVar5;
    }
    local_50 = plVar5[1];
    *plVar5 = (long)ns_00;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    BaseGenerator::FullNamespace_abi_cxx11_(&local_78,(BaseGenerator *)0x37c1d6,(char *)ns,ns_00);
    if (local_78._M_string_length != 0) {
      std::operator+(&local_98,"namespace ",&local_78);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_a8 = *plVar7;
        lStack_a0 = plVar5[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar7;
        local_b8 = (long *)*plVar5;
      }
      local_b0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    if (needs_includes) {
      std::__cxx11::string::append((char *)&local_58);
      std::__cxx11::string::append((char *)&local_58);
      std::__cxx11::string::append((char *)&local_58);
    }
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)(classcode->_M_dataplus)._M_p);
    if (local_78._M_string_length != 0) {
      std::__cxx11::string::append((char *)&local_58);
    }
    BaseGenerator::NamespaceDir_abi_cxx11_(&local_98,&local_38->super_BaseGenerator,ns,false);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)(defname->_M_dataplus)._M_p);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_a8 = *plVar7;
      lStack_a0 = plVar5[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar7;
      local_b8 = (long *)*plVar5;
    }
    local_b0 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    paVar1 = &local_98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (options->one_file == true) {
      std::__cxx11::string::_M_append
                ((char *)&local_b8,(ulong)(options->filename_suffix)._M_dataplus._M_p);
    }
    sVar2 = (options->filename_extension)._M_string_length;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    if (sVar2 == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,".cs","");
    }
    else {
      pcVar3 = (options->filename_extension)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)&local_98,pcVar3,pcVar3 + sVar2);
    }
    std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar4 = SaveFile((char *)local_b8,(char *)local_58,local_50,false);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_58 != (Namespace *)&local_48) {
      operator_delete(local_58,(ulong)((long)&(local_48->_M_dataplus)._M_p + 1));
    }
  }
  return bVar4;
}

Assistant:

bool SaveType(const std::string &defname, const Namespace &ns,
                const std::string &classcode, bool needs_includes,
                const IDLOptions &options) const {
    if (!classcode.length()) return true;

    std::string code =
        "// <auto-generated>\n"
        "//  " +
        std::string(FlatBuffersGeneratedWarning()) +
        "\n"
        "// </auto-generated>\n\n";

    std::string namespace_name = FullNamespace(".", ns);
    if (!namespace_name.empty()) {
      code += "namespace " + namespace_name + "\n{\n\n";
    }
    if (needs_includes) {
      code += "using global::System;\n";
      code += "using global::System.Collections.Generic;\n";
      code += "using global::Google.FlatBuffers;\n\n";
    }
    code += classcode;
    if (!namespace_name.empty()) { code += "\n}\n"; }
    auto filename = NamespaceDir(ns) + defname;
    if (options.one_file) { filename += options.filename_suffix; }
    filename +=
        options.filename_extension.empty() ? ".cs" : options.filename_extension;
    return SaveFile(filename.c_str(), code, false);
  }